

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void testing::Mock::UnregisterCallReaction(void *mock_obj)

{
  pair<std::_Rb_tree_iterator<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::_Rb_tree_iterator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  pVar1;
  void *local_18;
  void *mock_obj_local;
  
  local_18 = mock_obj;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  pVar1 = std::
          _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::internal::CallReaction>,_std::_Select1st<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
          ::equal_range((_Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::internal::CallReaction>,_std::_Select1st<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                         *)(anonymous_namespace)::g_uninteresting_call_reaction,&local_18);
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::internal::CallReaction>,_std::_Select1st<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  ::_M_erase_aux((_Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::internal::CallReaction>,_std::_Select1st<std::pair<const_void_*const,_testing::internal::CallReaction>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                  *)(anonymous_namespace)::g_uninteresting_call_reaction,
                 (_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_uninteresting_call_reaction.erase(mock_obj);
}